

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

int luaD_pcall(lua_State *L,Pfunc func,void *u,ptrdiff_t old_top,ptrdiff_t ef)

{
  lu_byte lVar1;
  CallInfo *pCVar2;
  ptrdiff_t pVar3;
  int status;
  int errcode;
  
  pCVar2 = L->ci;
  lVar1 = L->allowhook;
  pVar3 = L->errfunc;
  L->errfunc = ef;
  status = luaD_rawrunprotected(L,func,u);
  errcode = 0;
  if (status != 0) {
    L->ci = pCVar2;
    L->allowhook = lVar1;
    errcode = luaD_closeprotected(L,old_top,status);
    luaD_seterrorobj(L,errcode,(StkId)(old_top + (long)(L->stack).p));
    luaD_shrinkstack(L);
  }
  L->errfunc = pVar3;
  return errcode;
}

Assistant:

int luaD_pcall (lua_State *L, Pfunc func, void *u,
                ptrdiff_t old_top, ptrdiff_t ef) {
  int status;
  CallInfo *old_ci = L->ci;
  lu_byte old_allowhooks = L->allowhook;
  ptrdiff_t old_errfunc = L->errfunc;
  L->errfunc = ef;
  status = luaD_rawrunprotected(L, func, u);
  if (l_unlikely(status != LUA_OK)) {  /* an error occurred? */
    L->ci = old_ci;
    L->allowhook = old_allowhooks;
    status = luaD_closeprotected(L, old_top, status);
    luaD_seterrorobj(L, status, restorestack(L, old_top));
    luaD_shrinkstack(L);   /* restore stack size in case of overflow */
  }
  L->errfunc = old_errfunc;
  return status;
}